

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O3

void __thiscall EditorInterface::~EditorInterface(EditorInterface *this)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Theme *pTVar3;
  Gui *pGVar4;
  _Base_ptr p_Var5;
  source_loc loc;
  source_loc loc_00;
  _Rb_tree_node_base *p_Var6;
  logger *plVar7;
  _Base_ptr p_Var8;
  uint uVar9;
  string_view_t fmt;
  string_view_t fmt_00;
  uint numLeakedWidgets;
  uint local_54;
  size_t local_50 [4];
  
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__EditorInterface_0027a928;
  p_Var2 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->cursorLabel_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->cursorLabel_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->cursorLabel_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pTVar3 = (this->theme_)._M_t.super___uniq_ptr_impl<gui::Theme,_std::default_delete<gui::Theme>_>.
           _M_t.super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>.
           super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl;
  (this->theme_)._M_t.super___uniq_ptr_impl<gui::Theme,_std::default_delete<gui::Theme>_>._M_t.
  super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>.
  super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl = (Theme *)0x0;
  if (pTVar3 != (Theme *)0x0) {
    (*pTVar3->_vptr_Theme[1])();
  }
  pGVar4 = (this->gui_)._M_t.super___uniq_ptr_impl<gui::Gui,_std::default_delete<gui::Gui>_>._M_t.
           super__Tuple_impl<0UL,_gui::Gui_*,_std::default_delete<gui::Gui>_>.
           super__Head_base<0UL,_gui::Gui_*,_false>._M_head_impl;
  (this->gui_)._M_t.super___uniq_ptr_impl<gui::Gui,_std::default_delete<gui::Gui>_>._M_t.
  super__Tuple_impl<0UL,_gui::Gui_*,_std::default_delete<gui::Gui>_>.
  super__Head_base<0UL,_gui::Gui_*,_false>._M_head_impl = (Gui *)0x0;
  if (pGVar4 != (Gui *)0x0) {
    (**(code **)((long)(pGVar4->super_ContainerBase)._vptr_ContainerBase + 8))();
  }
  local_54 = 0;
  p_Var6 = (this->debugWidgets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->debugWidgets_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    uVar9 = 0;
    do {
      if ((p_Var6[2]._M_parent != (_Base_ptr)0x0) &&
         (*(int *)&(p_Var6[2]._M_parent)->_M_parent != 0)) {
        uVar9 = uVar9 + 1;
        local_54 = uVar9;
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    if (uVar9 != 0) {
      local_50[0] = (this->debugWidgets_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      plVar7 = spdlog::default_logger_raw();
      local_50[1] = 0;
      local_50[2] = 0;
      local_50[3] = 0;
      loc.funcname = (char *)0x0;
      loc.filename = (char *)0x0;
      loc.line = 0;
      loc._12_4_ = 0;
      fmt.size_ = 0x46;
      fmt.data_ = "EditorInterface detected {} memory leaks out of {} registered widgets:";
      spdlog::logger::log_<unsigned_int&,unsigned_long>(plVar7,loc,warn,fmt,&local_54,local_50);
      p_Var8 = (this->debugWidgets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var8 != p_Var1) {
        do {
          p_Var5 = p_Var8[2]._M_parent;
          if ((p_Var5 != (_Base_ptr)0x0) && (*(int *)&p_Var5->_M_parent != 0)) {
            local_50[0] = (size_t)*(int *)&p_Var5->_M_parent;
            plVar7 = spdlog::default_logger_raw();
            local_50[1] = 0;
            local_50[2] = 0;
            local_50[3] = 0;
            loc_00.funcname = (char *)0x0;
            loc_00.filename = (char *)0x0;
            loc_00.line = 0;
            loc_00._12_4_ = 0;
            fmt_00.size_ = 0x2d;
            fmt_00.data_ = "  Widget \"{}\" not cleaned up! (ref count {}).";
            spdlog::logger::log_<std::__cxx11::string_const&,long>
                      (plVar7,loc_00,warn,fmt_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 1),(long *)local_50);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      }
    }
  }
  p_Var2 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->cursorLabel_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pTVar3 = (this->theme_)._M_t.super___uniq_ptr_impl<gui::Theme,_std::default_delete<gui::Theme>_>.
           _M_t.super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>.
           super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl;
  if (pTVar3 != (Theme *)0x0) {
    (*pTVar3->_vptr_Theme[1])();
  }
  (this->theme_)._M_t.super___uniq_ptr_impl<gui::Theme,_std::default_delete<gui::Theme>_>._M_t.
  super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>.
  super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl = (Theme *)0x0;
  pGVar4 = (this->gui_)._M_t.super___uniq_ptr_impl<gui::Gui,_std::default_delete<gui::Gui>_>._M_t.
           super__Tuple_impl<0UL,_gui::Gui_*,_std::default_delete<gui::Gui>_>.
           super__Head_base<0UL,_gui::Gui_*,_false>._M_head_impl;
  if (pGVar4 != (Gui *)0x0) {
    (**(code **)((long)(pGVar4->super_ContainerBase)._vptr_ContainerBase + 8))();
  }
  (this->gui_)._M_t.super___uniq_ptr_impl<gui::Gui,_std::default_delete<gui::Gui>_>._M_t.
  super__Tuple_impl<0UL,_gui::Gui_*,_std::default_delete<gui::Gui>_>.
  super__Head_base<0UL,_gui::Gui_*,_false>._M_head_impl = (Gui *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
  ::~_Rb_tree(&(this->debugWidgets_)._M_t);
  return;
}

Assistant:

EditorInterface::~EditorInterface() {
    modalBackground_.reset();
    cursorLabel_.reset();
    theme_.reset();
    gui_.reset();

    unsigned int numLeakedWidgets = 0;
    for (const auto& widget : debugWidgets_) {
        if (!widget.second.expired()) {
            ++numLeakedWidgets;
        }
    }

    if (numLeakedWidgets > 0) {
        spdlog::warn("EditorInterface detected {} memory leaks out of {} registered widgets:", numLeakedWidgets, debugWidgets_.size());
        for (const auto& widget : debugWidgets_) {
            if (!widget.second.expired()) {
                spdlog::warn("  Widget \"{}\" not cleaned up! (ref count {}).", widget.first, widget.second.use_count());
            }
        }
    }
}